

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

llama_sampler * llama_sampler_chain_clone(llama_sampler *smpl)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  undefined8 *puVar3;
  undefined1 *puVar4;
  llama_sampler *chain;
  llama_sampler *smpl_00;
  undefined8 *puVar5;
  
  puVar2 = (undefined1 *)smpl->ctx;
  uVar1 = *puVar2;
  puVar4 = (undefined1 *)operator_new(0x30);
  *puVar4 = uVar1;
  *(undefined8 *)(puVar4 + 8) = 0;
  *(undefined8 *)(puVar4 + 0x10) = 0;
  *(undefined8 *)(puVar4 + 0x18) = 0;
  *(undefined8 *)(puVar4 + 0x20) = 0;
  *(undefined4 *)(puVar4 + 0x28) = 0;
  chain = (llama_sampler *)operator_new(0x10);
  chain->iface = &llama_sampler_chain_i;
  chain->ctx = puVar4;
  puVar3 = *(undefined8 **)(puVar2 + 0x10);
  for (puVar5 = *(undefined8 **)(puVar2 + 8); puVar5 != puVar3; puVar5 = puVar5 + 1) {
    smpl_00 = llama_sampler_clone((llama_sampler *)*puVar5);
    llama_sampler_chain_add(chain,smpl_00);
  }
  return chain;
}

Assistant:

static struct llama_sampler * llama_sampler_chain_clone(const struct llama_sampler * smpl) {
    const auto * chain_src = (const llama_sampler_chain *) smpl->ctx;

    auto * result = llama_sampler_chain_init(chain_src->params);

    for (auto * smpl : chain_src->samplers) {
        llama_sampler_chain_add(result, llama_sampler_clone(smpl));
    }

    return result;
}